

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O2

void path_insert(ps_astar_t *nbest,ps_latpath_t *newpath,int32 total_score)

{
  ps_latpath_t **pppVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  ps_latpath_s **pppVar5;
  ps_latpath_t **pppVar6;
  ps_latpath_s *ppVar7;
  ps_latpath_s *elem;
  
  uVar4 = 0;
  pppVar1 = &nbest->path_list;
  ppVar7 = (ps_latpath_s *)0x0;
  pppVar5 = pppVar1;
  while ((elem = *pppVar5, uVar4 < 500 && (elem != (ps_latpath_s *)0x0))) {
    if ((elem->node->info).fanin + elem->score < total_score) {
      newpath->next = elem;
      pppVar6 = &ppVar7->next;
      if (ppVar7 == (ps_latpath_s *)0x0) {
        pppVar6 = pppVar1;
      }
      goto LAB_00110534;
    }
    uVar4 = uVar4 + 1;
    ppVar7 = elem;
    pppVar5 = &elem->next;
  }
  if (uVar4 < 500) {
    pppVar5 = &ppVar7->next;
    if (ppVar7 == (ps_latpath_s *)0x0) {
      pppVar5 = pppVar1;
    }
    newpath->next = elem;
    *pppVar5 = newpath;
    if (elem == (ps_latpath_s *)0x0) {
      pppVar6 = &nbest->path_tail;
LAB_00110534:
      *pppVar6 = newpath;
    }
    nbest->n_hyp_insert = nbest->n_hyp_insert + 1;
    uVar2 = nbest->insert_depth;
    uVar3 = nbest->n_path;
    nbest->insert_depth = uVar4 + uVar2;
    nbest->n_path = uVar3 + 1;
  }
  else {
    nbest->path_tail = ppVar7;
    ppVar7->next = (ps_latpath_s *)0x0;
    nbest->n_path = 500;
    __listelem_free__(nbest->latpath_alloc,newpath,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                      ,0x66e);
    while (nbest->n_hyp_reject = nbest->n_hyp_reject + 1, elem != (ps_latpath_s *)0x0) {
      ppVar7 = elem->next;
      __listelem_free__(nbest->latpath_alloc,elem,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                        ,0x673);
      elem = ppVar7;
    }
  }
  return;
}

Assistant:

static void
path_insert(ps_astar_t *nbest, ps_latpath_t *newpath, int32 total_score)
{
    ps_latpath_t *prev, *p;
    int32 i;

    prev = NULL;
    for (i = 0, p = nbest->path_list; (i < MAX_PATHS) && p; p = p->next, i++) {
        if ((p->score + p->node->info.rem_score) < total_score)
            break;
        prev = p;
    }

    /* newpath should be inserted between prev and p */
    if (i < MAX_PATHS) {
        /* Insert new partial hyp */
        newpath->next = p;
        if (!prev)
            nbest->path_list = newpath;
        else
            prev->next = newpath;
        if (!p)
            nbest->path_tail = newpath;

        nbest->n_path++;
        nbest->n_hyp_insert++;
        nbest->insert_depth += i;
    }
    else {
        /* newpath score too low; reject it and also prune paths beyond MAX_PATHS */
        nbest->path_tail = prev;
        prev->next = NULL;
        nbest->n_path = MAX_PATHS;
        listelem_free(nbest->latpath_alloc, newpath);

        nbest->n_hyp_reject++;
        for (; p; p = newpath) {
            newpath = p->next;
            listelem_free(nbest->latpath_alloc, p);
            nbest->n_hyp_reject++;
        }
    }
}